

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,String *value)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  char local_31;
  
  Message::Message((Message *)&local_40);
  poVar4 = (ostream *)(local_40.ptr_ + 0x10);
  if (local_40.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  pcVar2 = value->c_str_;
  if (pcVar2 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(null)",6);
  }
  else if (value->length_ != 0) {
    sVar3 = 0;
    do {
      cVar1 = pcVar2[sVar3];
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\\0",2);
      }
      else {
        local_31 = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != value->length_);
  }
  AppendMessage(this,(Message *)&local_40);
  if (local_40.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_40.ptr_ + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }